

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

uint llvm::partAsHex(char *dst,integerPart part,uint count,char *hexDigitChars)

{
  uint result;
  char *hexDigitChars_local;
  ulong uStack_18;
  uint count_local;
  integerPart part_local;
  char *dst_local;
  
  if (count == 0 || 0x10 < count) {
    __assert_fail("count != 0 && count <= APFloatBase::integerPartWidth / 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x263,
                  "unsigned int llvm::partAsHex(char *, APFloatBase::integerPart, unsigned int, const char *)"
                 );
  }
  uStack_18 = part >> (0x40U - (char)(count << 2) & 0x3f);
  hexDigitChars_local._4_4_ = count;
  while (hexDigitChars_local._4_4_ != 0) {
    dst[hexDigitChars_local._4_4_ - 1] = hexDigitChars[uStack_18 & 0xf];
    uStack_18 = uStack_18 >> 4;
    hexDigitChars_local._4_4_ = hexDigitChars_local._4_4_ - 1;
  }
  return count;
}

Assistant:

static unsigned int
partAsHex (char *dst, APFloatBase::integerPart part, unsigned int count,
           const char *hexDigitChars)
{
  unsigned int result = count;

  assert(count != 0 && count <= APFloatBase::integerPartWidth / 4);

  part >>= (APFloatBase::integerPartWidth - 4 * count);
  while (count--) {
    dst[count] = hexDigitChars[part & 0xf];
    part >>= 4;
  }

  return result;
}